

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_recover
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,
              secp256k1_ecdsa_recoverable_signature *signature,uchar *msghash32)

{
  int i;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar5;
  void *pvVar6;
  secp256k1_ecdsa_recoverable_signature *in_R8;
  char *pcVar7;
  undefined8 uStack_2b0;
  secp256k1_scalar r;
  secp256k1_scalar s;
  secp256k1_scalar m;
  int recid;
  secp256k1_scalar u2;
  secp256k1_scalar u1;
  secp256k1_scalar rn;
  secp256k1_fe fx;
  uchar brx [32];
  secp256k1_ge q;
  secp256k1_ge x;
  secp256k1_gej local_160;
  secp256k1_gej xj;
  ulong uVar4;
  
  if (ctx == (secp256k1_context *)0x0) {
    pcVar5 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modules/recovery/main_impl.h"
    ;
    pcVar7 = "test condition failed: ctx != NULL";
    uStack_2b0 = 0x8e;
    goto LAB_001071f8;
  }
  if (msghash32 == (uchar *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar5 = "msghash32 != NULL";
  }
  else if (signature == (secp256k1_ecdsa_recoverable_signature *)0x0) {
    pvVar6 = (ctx->illegal_callback).data;
    pcVar5 = "signature != NULL";
  }
  else {
    if (pubkey != (secp256k1_pubkey *)0x0) {
      secp256k1_ecdsa_recoverable_signature_load
                ((secp256k1_context *)&r,&s,(secp256k1_scalar *)&recid,(int *)signature,in_R8);
      if (3 < (uint)recid) {
        pcVar5 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modules/recovery/main_impl.h"
        ;
        pcVar7 = "test condition failed: recid >= 0 && recid < 4";
        uStack_2b0 = 0x94;
LAB_001071f8:
        fprintf(_stderr,"%s:%d: %s\n",pcVar5,uStack_2b0,pcVar7);
        abort();
      }
      secp256k1_scalar_set_b32(&m,msghash32,(int *)0x0);
      iVar1 = secp256k1_scalar_is_zero(&r);
      if ((iVar1 == 0) && (iVar1 = secp256k1_scalar_is_zero(&s), iVar1 == 0)) {
        secp256k1_scalar_get_b32(brx,&r);
        iVar1 = secp256k1_fe_set_b32_limit(&fx,brx);
        if (iVar1 == 0) {
          pcVar5 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/modules/recovery/main_impl.h"
          ;
          pcVar7 = "test condition failed: r";
          uStack_2b0 = 0x67;
          goto LAB_001071f8;
        }
        if (1 < (uint)recid) {
          secp256k1_fe_verify(&fx);
          secp256k1_fe_verify(&secp256k1_ecdsa_const_p_minus_order);
          if (fx.normalized == 0) {
            pcVar5 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/secp256k1/src/field_impl.h"
            ;
            pcVar7 = "test condition failed: a->normalized";
            uStack_2b0 = 0x108;
            goto LAB_001071f8;
          }
          uVar2 = 4;
          do {
            if ((int)uVar2 < 0) goto LAB_00107000;
            uVar4 = (ulong)uVar2;
            uVar3 = (ulong)uVar2;
            if (secp256k1_ecdsa_const_p_minus_order.n[uVar3] < fx.n[uVar4]) goto LAB_00107000;
            uVar2 = uVar2 - 1;
          } while (secp256k1_ecdsa_const_p_minus_order.n[uVar3] <= fx.n[uVar4]);
          secp256k1_fe_add(&fx,&secp256k1_ecdsa_const_order_as_fe);
        }
        iVar1 = secp256k1_ge_set_xo_var(&x,&fx,recid & 1);
        if (iVar1 != 0) {
          secp256k1_gej_set_ge(&xj,&x);
          secp256k1_scalar_inverse_var(&rn,&r);
          secp256k1_scalar_mul(&u1,&rn,&m);
          secp256k1_scalar_negate(&u1,&u1);
          secp256k1_scalar_mul(&u2,&rn,&s);
          secp256k1_ecmult(&local_160,&xj,&u2,&u1);
          secp256k1_ge_set_gej_var(&q,&local_160);
          iVar1 = secp256k1_gej_is_infinity(&local_160);
          if (iVar1 == 0) {
            secp256k1_pubkey_save(pubkey,&q);
            return 1;
          }
        }
      }
LAB_00107000:
      pubkey->data[0x30] = '\0';
      pubkey->data[0x31] = '\0';
      pubkey->data[0x32] = '\0';
      pubkey->data[0x33] = '\0';
      pubkey->data[0x34] = '\0';
      pubkey->data[0x35] = '\0';
      pubkey->data[0x36] = '\0';
      pubkey->data[0x37] = '\0';
      pubkey->data[0x38] = '\0';
      pubkey->data[0x39] = '\0';
      pubkey->data[0x3a] = '\0';
      pubkey->data[0x3b] = '\0';
      pubkey->data[0x3c] = '\0';
      pubkey->data[0x3d] = '\0';
      pubkey->data[0x3e] = '\0';
      pubkey->data[0x3f] = '\0';
      pubkey->data[0x20] = '\0';
      pubkey->data[0x21] = '\0';
      pubkey->data[0x22] = '\0';
      pubkey->data[0x23] = '\0';
      pubkey->data[0x24] = '\0';
      pubkey->data[0x25] = '\0';
      pubkey->data[0x26] = '\0';
      pubkey->data[0x27] = '\0';
      pubkey->data[0x28] = '\0';
      pubkey->data[0x29] = '\0';
      pubkey->data[0x2a] = '\0';
      pubkey->data[0x2b] = '\0';
      pubkey->data[0x2c] = '\0';
      pubkey->data[0x2d] = '\0';
      pubkey->data[0x2e] = '\0';
      pubkey->data[0x2f] = '\0';
      pubkey->data[0x10] = '\0';
      pubkey->data[0x11] = '\0';
      pubkey->data[0x12] = '\0';
      pubkey->data[0x13] = '\0';
      pubkey->data[0x14] = '\0';
      pubkey->data[0x15] = '\0';
      pubkey->data[0x16] = '\0';
      pubkey->data[0x17] = '\0';
      pubkey->data[0x18] = '\0';
      pubkey->data[0x19] = '\0';
      pubkey->data[0x1a] = '\0';
      pubkey->data[0x1b] = '\0';
      pubkey->data[0x1c] = '\0';
      pubkey->data[0x1d] = '\0';
      pubkey->data[0x1e] = '\0';
      pubkey->data[0x1f] = '\0';
      pubkey->data[0] = '\0';
      pubkey->data[1] = '\0';
      pubkey->data[2] = '\0';
      pubkey->data[3] = '\0';
      pubkey->data[4] = '\0';
      pubkey->data[5] = '\0';
      pubkey->data[6] = '\0';
      pubkey->data[7] = '\0';
      pubkey->data[8] = '\0';
      pubkey->data[9] = '\0';
      pubkey->data[10] = '\0';
      pubkey->data[0xb] = '\0';
      pubkey->data[0xc] = '\0';
      pubkey->data[0xd] = '\0';
      pubkey->data[0xe] = '\0';
      pubkey->data[0xf] = '\0';
      return 0;
    }
    pvVar6 = (ctx->illegal_callback).data;
    pcVar5 = "pubkey != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar5,pvVar6);
  return 0;
}

Assistant:

int secp256k1_ecdsa_recover(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const secp256k1_ecdsa_recoverable_signature *signature, const unsigned char *msghash32) {
    secp256k1_ge q;
    secp256k1_scalar r, s;
    secp256k1_scalar m;
    int recid;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(msghash32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_ecdsa_recoverable_signature_load(ctx, &r, &s, &recid, signature);
    VERIFY_CHECK(recid >= 0 && recid < 4);  /* should have been caught in parse_compact */
    secp256k1_scalar_set_b32(&m, msghash32, NULL);
    if (secp256k1_ecdsa_sig_recover(&r, &s, &q, &m, recid)) {
        secp256k1_pubkey_save(pubkey, &q);
        return 1;
    } else {
        memset(pubkey, 0, sizeof(*pubkey));
        return 0;
    }
}